

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

Result<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_> * __thiscall
wallet::anon_unknown_5::WalletLoaderImpl::restoreWallet
          (Result<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
           *__return_storage_ptr__,WalletLoaderImpl *this,path *backup_file,string *wallet_name,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_> uVar5;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sStack_d8;
  unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_> wallet;
  DatabaseStatus status;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  bilingual_str error;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  paVar2 = &error.original.field_2;
  error.original._M_string_length = 0;
  error.original.field_2._M_local_buf[0] = '\0';
  paVar3 = &error.translated.field_2;
  error.translated._M_string_length = 0;
  error.translated.field_2._M_local_buf[0] = '\0';
  error.original._M_dataplus._M_p = (pointer)paVar2;
  error.translated._M_dataplus._M_p = (pointer)paVar3;
  RestoreWallet((wallet *)&sStack_d8,&this->m_context,backup_file,(string *)wallet_name,
                (optional<bool>)0x101,&status,&error,
                (vector<bilingual_str,_std::allocator<bilingual_str>_> *)warnings);
  interfaces::MakeWallet((interfaces *)&wallet,&this->m_context,&sStack_d8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      sStack_d8.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               sStack_d8.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  uVar5._M_t.super___uniq_ptr_impl<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>.
  _M_t.super__Tuple_impl<0UL,_interfaces::Wallet_*,_std::default_delete<interfaces::Wallet>_>.
  super__Head_base<0UL,_interfaces::Wallet_*,_false>._M_head_impl =
       wallet._M_t.
       super___uniq_ptr_impl<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>._M_t.
       super__Tuple_impl<0UL,_interfaces::Wallet_*,_std::default_delete<interfaces::Wallet>_>.
       super__Head_base<0UL,_interfaces::Wallet_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)
      wallet._M_t.
      super___uniq_ptr_impl<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>._M_t.
      super__Tuple_impl<0UL,_interfaces::Wallet_*,_std::default_delete<interfaces::Wallet>_>.
      super__Head_base<0UL,_interfaces::Wallet_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)0x0) {
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,error.original._M_dataplus._M_p,
               error.original._M_dataplus._M_p + error.original._M_string_length);
    local_98 = &local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,error.translated._M_dataplus._M_p,
               error.translated._M_dataplus._M_p + error.translated._M_string_length);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
                     .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
      .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
      super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
      super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
      super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
      super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> = puVar1;
    if (local_b8 == &local_a8) {
      *puVar1 = CONCAT71(uStack_a7,local_a8);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
               .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
       0x18) = uStack_a0;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
        .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
        super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
        super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
        super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
        super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> = local_b8
      ;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
                        .
                        super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .
                        super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .
                        super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                + 0x10) = CONCAT71(uStack_a7,local_a8);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
             .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> + 8)
         = local_b0;
    local_b0 = 0;
    local_a8 = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
                     .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
             + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
             .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
     0x20) = puVar1;
    if (local_98 == &local_88) {
      *puVar1 = CONCAT71(uStack_87,local_88);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
               .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
       0x38) = uStack_80;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
               .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
       0x20) = local_98;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
                        .
                        super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .
                        super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .
                        super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                + 0x30) = CONCAT71(uStack_87,local_88);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
             .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
     0x28) = local_90;
    local_90 = 0;
    local_88 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
             .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
     0x40) = '\0';
    local_b8 = &local_a8;
    local_98 = &local_88;
  }
  else {
    wallet._M_t.super___uniq_ptr_impl<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>.
    _M_t.super__Tuple_impl<0UL,_interfaces::Wallet_*,_std::default_delete<interfaces::Wallet>_>.
    super__Head_base<0UL,_interfaces::Wallet_*,_false>._M_head_impl =
         (__uniq_ptr_data<interfaces::Wallet,_std::default_delete<interfaces::Wallet>,_true,_true>)
         (__uniq_ptr_impl<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)0x0;
    *(__uniq_ptr_data<interfaces::Wallet,_std::default_delete<interfaces::Wallet>,_true,_true> *)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
      .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
      super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
      super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
      super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
      super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> =
         uVar5._M_t.
         super___uniq_ptr_impl<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>._M_t.
         super__Tuple_impl<0UL,_interfaces::Wallet_*,_std::default_delete<interfaces::Wallet>_>.
         super__Head_base<0UL,_interfaces::Wallet_*,_false>._M_head_impl;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
             .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
     0x40) = '\x01';
  }
  if ((__uniq_ptr_impl<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)
      wallet._M_t.
      super___uniq_ptr_impl<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>._M_t.
      super__Tuple_impl<0UL,_interfaces::Wallet_*,_std::default_delete<interfaces::Wallet>_>.
      super__Head_base<0UL,_interfaces::Wallet_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)0x0) {
    (**(code **)(*(long *)wallet._M_t.
                          super___uniq_ptr_impl<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_interfaces::Wallet_*,_std::default_delete<interfaces::Wallet>_>
                          .super__Head_base<0UL,_interfaces::Wallet_*,_false>._M_head_impl + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.translated._M_dataplus._M_p != paVar3) {
    operator_delete(error.translated._M_dataplus._M_p,
                    CONCAT71(error.translated.field_2._M_allocated_capacity._1_7_,
                             error.translated.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.original._M_dataplus._M_p != paVar2) {
    operator_delete(error.original._M_dataplus._M_p,
                    CONCAT71(error.original.field_2._M_allocated_capacity._1_7_,
                             error.original.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<std::unique_ptr<Wallet>> restoreWallet(const fs::path& backup_file, const std::string& wallet_name, std::vector<bilingual_str>& warnings) override
    {
        DatabaseStatus status;
        bilingual_str error;
        std::unique_ptr<Wallet> wallet{MakeWallet(m_context, RestoreWallet(m_context, backup_file, wallet_name, /*load_on_start=*/true, status, error, warnings))};
        if (wallet) {
            return wallet;
        } else {
            return util::Error{error};
        }
    }